

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

ON_HatchPattern * ON_HatchPattern::Cast(ON_Object *p)

{
  bool bVar1;
  ON_HatchPattern *pOVar2;
  
  if (p != (ON_Object *)0x0) {
    bVar1 = ON_Object::IsKindOf(p,&m_ON_HatchPattern_class_rtti);
    pOVar2 = (ON_HatchPattern *)0x0;
    if (bVar1) {
      pOVar2 = (ON_HatchPattern *)p;
    }
    return pOVar2;
  }
  return (ON_HatchPattern *)0x0;
}

Assistant:

ON_HatchPattern::HatchFillType ON_HatchPattern::HatchFillTypeFromUnsigned(
  unsigned hatch_fill_type_as_unsigned
  )
{
  switch (hatch_fill_type_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Solid);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Lines);
    //ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Gradient);
  }
  ON_ERROR("Invalid hatch_fill_type_as_unsigned value.");
  return ON_HatchPattern::HatchFillType::Solid;
}